

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

CService *
LookupNumeric(CService *__return_storage_ptr__,string *name,uint16_t portDefault,
             DNSLookupFn dns_lookup_function)

{
  bool bVar1;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_RCX;
  undefined6 in_register_00000012;
  long in_FS_OFFSET;
  string_view str;
  DNSLookupFn in_stack_ffffffffffffff58;
  CService local_88;
  _Optional_payload_base<CService> local_60;
  long local_30;
  
  str._M_str._2_6_ = in_register_00000012;
  str._M_str._0_2_ = portDefault;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  str._M_len = (size_t)(name->_M_dataplus)._M_p;
  bVar1 = util::ContainsNoNUL((util *)name->_M_string_length,str);
  if (bVar1) {
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)&stack0xffffffffffffff58,in_RCX);
    Lookup((optional<CService> *)&local_60,name,portDefault,false,in_stack_ffffffffffffff58);
    CService::CService(&local_88);
    std::optional<CService>::value_or<CService>
              (__return_storage_ptr__,(optional<CService> *)&local_60,&local_88);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_88);
    std::_Optional_payload_base<CService>::_M_reset(&local_60);
    std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return __return_storage_ptr__;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    CService::CService(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CService LookupNumeric(const std::string& name, uint16_t portDefault, DNSLookupFn dns_lookup_function)
{
    if (!ContainsNoNUL(name)) {
        return {};
    }
    // "1.2:345" will fail to resolve the ip, but will still set the port.
    // If the ip fails to resolve, re-init the result.
    return Lookup(name, portDefault, /*fAllowLookup=*/false, dns_lookup_function).value_or(CService{});
}